

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitSIMDTernary
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,
          SIMDTernary *curr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Literal *pLVar3;
  Literal local_1a8;
  Literal local_190;
  Literal local_178;
  Literal local_160;
  Literal local_148;
  Literal local_130;
  Literal local_118;
  Literal local_100;
  undefined1 local_e8 [8];
  Flow flow;
  Literal c;
  undefined1 local_58 [8];
  Literal a;
  Literal b;
  
  visit((Flow *)local_e8,this,curr->a);
  if (flow.breakTo.super_IString.str._M_len != 0) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_e8);
    goto LAB_00d5cf1f;
  }
  pLVar3 = Flow::getSingleValue((Flow *)local_e8);
  Literal::Literal((Literal *)local_58,pLVar3);
  visit((Flow *)&flow.breakTo.super_IString.str._M_str,this,curr->b);
  Flow::operator=((Flow *)local_e8,(Flow *)&flow.breakTo.super_IString.str._M_str);
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    pLVar3 = Flow::getSingleValue((Flow *)local_e8);
    Literal::Literal((Literal *)&a.type,pLVar3);
    visit((Flow *)&flow.breakTo.super_IString.str._M_str,this,curr->c);
    Flow::operator=((Flow *)local_e8,(Flow *)&flow.breakTo.super_IString.str._M_str);
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
    if (flow.breakTo.super_IString.str._M_len == 0) {
      pLVar3 = Flow::getSingleValue((Flow *)local_e8);
      Literal::Literal((Literal *)&flow.breakTo.super_IString.str._M_str,pLVar3);
      uVar2 = NONCONSTANT_FLOW._8_8_;
      uVar1 = NONCONSTANT_FLOW._0_8_;
      switch(curr->op) {
      case Bitselect:
      case LaneselectI8x16:
      case LaneselectI16x8:
      case LaneselectI32x4:
      case LaneselectI64x2:
        Literal::bitselectV128
                  (&local_1a8,(Literal *)&flow.breakTo.super_IString.str._M_str,(Literal *)local_58,
                   (Literal *)&a.type);
        Flow::Flow(__return_storage_ptr__,&local_1a8);
        pLVar3 = &local_1a8;
        break;
      case RelaxedMaddVecF16x8:
        if (this->relaxedBehavior != NonConstant) {
          Literal::relaxedMaddF16x8
                    (&local_190,(Literal *)local_58,(Literal *)&a.type,
                     (Literal *)&flow.breakTo.super_IString.str._M_str);
          Flow::Flow(__return_storage_ptr__,&local_190);
          pLVar3 = &local_190;
          break;
        }
LAB_00d5cee0:
        *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                          fixed._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        type.id = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.i64 = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar1;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)uVar2;
        goto LAB_00d5cf01;
      case RelaxedNmaddVecF16x8:
        if (this->relaxedBehavior == NonConstant) goto LAB_00d5cee0;
        Literal::relaxedNmaddF16x8
                  (&local_178,(Literal *)local_58,(Literal *)&a.type,
                   (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,&local_178);
        pLVar3 = &local_178;
        break;
      case RelaxedMaddVecF32x4:
        if (this->relaxedBehavior == NonConstant) goto LAB_00d5cee0;
        Literal::relaxedMaddF32x4
                  (&local_160,(Literal *)local_58,(Literal *)&a.type,
                   (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,&local_160);
        pLVar3 = &local_160;
        break;
      case RelaxedNmaddVecF32x4:
        if (this->relaxedBehavior == NonConstant) goto LAB_00d5cee0;
        Literal::relaxedNmaddF32x4
                  (&local_148,(Literal *)local_58,(Literal *)&a.type,
                   (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,&local_148);
        pLVar3 = &local_148;
        break;
      case RelaxedMaddVecF64x2:
        if (this->relaxedBehavior == NonConstant) goto LAB_00d5cee0;
        Literal::relaxedMaddF64x2
                  (&local_130,(Literal *)local_58,(Literal *)&a.type,
                   (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,&local_130);
        pLVar3 = &local_130;
        break;
      case RelaxedNmaddVecF64x2:
        if (this->relaxedBehavior == NonConstant) goto LAB_00d5cee0;
        Literal::relaxedNmaddF64x2
                  (&local_118,(Literal *)local_58,(Literal *)&a.type,
                   (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,&local_118);
        pLVar3 = &local_118;
        break;
      case DotI8x16I7x16AddSToVecI32x4:
        if (this->relaxedBehavior == NonConstant) goto LAB_00d5cee0;
        Literal::dotSI8x16toI16x8Add
                  (&local_100,(Literal *)local_58,(Literal *)&a.type,
                   (Literal *)&flow.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,&local_100);
        pLVar3 = &local_100;
        break;
      default:
        handle_unreachable("invalid op",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                           ,0x523);
      }
      Literal::~Literal(pLVar3);
LAB_00d5cf01:
      Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_e8);
    }
    Literal::~Literal((Literal *)&a.type);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_e8);
  }
  Literal::~Literal((Literal *)local_58);
LAB_00d5cf1f:
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDTernary(SIMDTernary* curr) {
    NOTE_ENTER("SIMDBitselect");
    Flow flow = self()->visit(curr->a);
    if (flow.breaking()) {
      return flow;
    }
    Literal a = flow.getSingleValue();
    flow = self()->visit(curr->b);
    if (flow.breaking()) {
      return flow;
    }
    Literal b = flow.getSingleValue();
    flow = self()->visit(curr->c);
    if (flow.breaking()) {
      return flow;
    }
    Literal c = flow.getSingleValue();
    switch (curr->op) {
      case Bitselect:
      case LaneselectI8x16:
      case LaneselectI16x8:
      case LaneselectI32x4:
      case LaneselectI64x2:
        return c.bitselectV128(a, b);

      case RelaxedMaddVecF16x8:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        return a.relaxedMaddF16x8(b, c);
      case RelaxedNmaddVecF16x8:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        return a.relaxedNmaddF16x8(b, c);
      case RelaxedMaddVecF32x4:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        return a.relaxedMaddF32x4(b, c);
      case RelaxedNmaddVecF32x4:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        return a.relaxedNmaddF32x4(b, c);
      case RelaxedMaddVecF64x2:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        return a.relaxedMaddF64x2(b, c);
      case RelaxedNmaddVecF64x2:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        return a.relaxedNmaddF64x2(b, c);
      case DotI8x16I7x16AddSToVecI32x4:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        return a.dotSI8x16toI16x8Add(b, c);
    }
    WASM_UNREACHABLE("invalid op");
  }